

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Food::Food(Food *this,Point *p)

{
  Object *local_10;
  
  (this->super_Object).position.x = 0;
  (this->super_Object).position.y = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_move_00107c78;
  (this->super_Object).ch = '%';
  Point::operator=(&(this->super_Object).position,p);
  local_10 = &this->super_Object;
  std::vector<Object*,std::allocator<Object*>>::emplace_back<Object*>
            ((vector<Object*,std::allocator<Object*>> *)&Object::obj,&local_10);
  (this->super_Object).on_map = true;
  return;
}

Assistant:

Food::Food(const Point& p){
	ch = CHR_FOOD;
	position = p;
	obj.push_back(this);
	on_map = true;
}